

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::Value::display(Value *this,ostream *o)

{
  ostream *poVar1;
  
  if (this->field_0x18 == '\0') {
    std::ostream::operator<<(o,*(int *)&this->field_0x8);
    return;
  }
  if (this->field_0x18 == '\x01') {
    if (this->shift_amount != '\0') {
      std::operator<<(o,"(");
    }
    (*(code *)**(undefined8 **)&this->field_0x8)(&this->field_0x8,o);
    if ((this->field_0x18 != '\0') && (this->shift_amount != '\0')) {
      std::operator<<(o,", ");
      arm::display_shift(o,this->shift);
      poVar1 = std::operator<<(o," ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,")");
      return;
    }
  }
  return;
}

Assistant:

void Value::display(std::ostream& o) const {
  if (auto x = std::get_if<VarId>(this)) {
    if (has_shift()) {
      o << "(";
    }
    o << *x;
    if (has_shift()) {
      o << ", ";
      arm::display_shift(o, shift);
      o << " " << (unsigned int)shift_amount << ")";
    }
  } else if (auto x = std::get_if<int32_t>(this)) {
    o << *x;
  }
}